

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

void Dau_NetworkEnum(int nVars)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Wec_t *p;
  Vec_Wec_t *p_00;
  long lVar6;
  long lVar7;
  word wVar8;
  uint *pTable;
  Vec_Int_t *pVVar9;
  abctime aVar10;
  Vec_Int_t *vNpns;
  Vec_Int_t *vNpns_;
  word wVar11;
  int Entry2;
  int Entry2_00;
  abctime time;
  ulong uVar12;
  abctime time_00;
  abctime time_01;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  word wVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  char *local_1c0;
  word uTruth;
  abctime local_190;
  Vec_Wec_t *local_188;
  ulong local_180;
  ulong local_178;
  int local_16c;
  ulong local_168;
  long local_160;
  ulong local_158;
  long local_150;
  ulong local_148;
  ulong local_140;
  long local_138;
  char *local_130;
  long local_128;
  long local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  long local_100;
  char pFileName [200];
  
  iVar16 = nVars;
  local_190 = Abc_Clock();
  uVar13 = (1 << ((byte)nVars & 0x1f)) - 2;
  p = Vec_WecStart(iVar16);
  p_00 = Vec_WecStart(iVar16);
  lVar6 = (long)nVars;
  lVar7 = lVar6 + -1;
  wVar8 = Abc_Tt6Mask(1 << ((byte)nVars - 1 & 0x1f));
  sprintf(pFileName,"tableW%d.data",(ulong)uVar13);
  uVar19 = 1;
  pTable = Dau_ReadFile(pFileName,1 << ((byte)uVar13 & 0x1f));
  *(byte *)((long)pTable + 3) = *(byte *)((long)pTable + 3) | 0x80;
  pbVar1 = (byte *)((long)pTable + (wVar8 & 0xffffffff) * 4 + 3);
  *pbVar1 = *pbVar1 | 0x80;
  pVVar9 = Vec_WecEntry(p,0);
  Vec_IntPushTwo(pVVar9,(int)wVar8,Entry2);
  pVVar9 = Vec_WecEntry(p_00,0);
  Vec_IntPushTwo(pVVar9,(int)wVar8,Entry2_00);
  pVVar9 = Vec_WecEntry(p,0);
  uVar13 = pVVar9->nSize;
  uVar3 = Vec_WecSizeSize(p);
  pVVar9 = Vec_WecEntry(p_00,0);
  uVar2 = pVVar9->nSize;
  local_188 = p_00;
  uVar4 = Vec_WecSizeSize(p_00);
  printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",0,(ulong)uVar13,
         (ulong)uVar3,(ulong)uVar2,(ulong)uVar4);
  aVar10 = Abc_Clock();
  Abc_PrintTime(0x816bba,(char *)(aVar10 - local_190),time);
  local_128 = lVar6 * 8 + -8;
  local_130 = "Final results:" + lVar6 * 8 + 10;
  do {
    uVar13 = (uint)uVar19;
    if (uVar13 == 0x20) break;
    if (1 < uVar13) {
      Vec_WecEntry(p,uVar13 - 2);
    }
    pVVar9 = Vec_WecEntry(p,uVar13 - 1);
    vNpns = Vec_WecEntry(p,uVar13);
    local_148 = uVar19;
    vNpns_ = Vec_WecEntry(local_188,uVar13);
    for (iVar16 = 0; iVar16 < pVVar9->nSize; iVar16 = iVar16 + 1) {
      iVar5 = Vec_IntEntry(pVVar9,iVar16);
      uTruth = (long)iVar5 << 0x20 | (long)iVar5;
      uVar13 = Abc_TtSupportSize(&uTruth,nVars);
      if (uVar13 == 6) {
        iVar14 = (int)lVar7 + -6;
      }
      else {
        iVar14 = (int)lVar7 - uVar13;
        iVar5 = Abc_Tt6HasVar(uTruth,iVar14);
        if (iVar5 != 0) {
          __assert_fail("nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                        ,0xd3,"void Dau_NetworkEnum(int)");
        }
      }
      local_138 = (long)iVar14;
      local_150 = (long)(int)uVar13;
      local_140 = 0;
      if (0 < (int)uVar13) {
        local_140 = (ulong)uVar13;
      }
      local_118 = (ulong)uVar13;
      local_120 = -local_118;
      local_168 = 0;
      for (uVar19 = 0; uVar19 != local_140; uVar19 = uVar19 + 1) {
        lVar6 = lVar7 - uVar19;
        wVar8 = Abc_Tt6Cofactor0(uTruth,(int)lVar6);
        wVar11 = Abc_Tt6Cofactor1(uTruth,(int)lVar6);
        local_180 = uVar19;
        iVar5 = 2;
        while( true ) {
          iVar14 = iVar5;
          if (iVar14 == 0) break;
          iVar5 = iVar14 + -1;
          if ((int)uVar13 < nVars) {
            if (iVar14 == 2) {
              uVar19 = s_Truths6[local_138] & s_Truths6[lVar6];
              Dau_AddFunction(wVar8 & ~uVar19 | uVar19 & wVar11,nVars,pTable,vNpns,vNpns_);
              wVar17 = ~uVar19 & wVar11 | uVar19 & wVar8;
            }
            else {
              wVar17 = (wVar11 ^ wVar8) & (s_Truths6[local_138] ^ s_Truths6[lVar6]) ^ wVar8;
            }
            Dau_AddFunction(wVar17,nVars,pTable,vNpns,vNpns_);
            uVar19 = local_180;
          }
        }
        for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
          for (lVar20 = 0; local_120 != lVar20; lVar20 = lVar20 + -1) {
            if (uVar19 + lVar20 != 0) {
              uVar19 = s_Truths6[lVar6];
              uVar12 = *(ulong *)((long)s_Truths6 + local_128 + lVar20 * 8);
              if (iVar5 == 0) {
                uVar15 = uVar12 & uVar19;
                local_178 = uVar19;
                Dau_AddFunction(wVar8 & ~uVar15 | uVar15 & wVar11,nVars,pTable,vNpns,vNpns_);
                Dau_AddFunction(~uVar15 & wVar11 | uVar15 & wVar8,nVars,pTable,vNpns,vNpns_);
                uVar19 = ~uVar12 & local_178;
                Dau_AddFunction(wVar8 & ~uVar19 | uVar19 & wVar11,nVars,pTable,vNpns,vNpns_);
                wVar17 = ~uVar19 & wVar11 | uVar19 & wVar8;
              }
              else {
                wVar17 = (wVar11 ^ wVar8) & (uVar12 ^ uVar19) ^ wVar8;
              }
              Dau_AddFunction(wVar17,nVars,pTable,vNpns,vNpns_);
              uVar19 = local_180;
            }
          }
        }
        for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
          local_1c0 = local_130;
          local_160 = 1;
          uVar15 = 0;
          lVar6 = local_150;
          uVar12 = local_168;
          local_16c = iVar5;
          while (uVar15 != local_118) {
            local_158 = uVar15;
            if (uVar15 != uVar19) {
              local_100 = lVar7 - uVar15;
              uVar19 = 0xffffffffffffffff;
              local_178 = uVar12;
              for (lVar20 = local_160; lVar20 < lVar6; lVar20 = lVar20 + 1) {
                if (uVar12 != uVar19) {
                  uVar12 = *(ulong *)(local_1c0 + uVar19 * 8);
                  uVar15 = s_Truths6[local_100];
                  if (iVar5 == 0) {
                    uVar18 = uVar15 & uVar12;
                    Dau_AddFunction(wVar8 & ~uVar18 | uVar18 & wVar11,nVars,pTable,vNpns,vNpns_);
                    Dau_AddFunction(~uVar18 & wVar11 | uVar18 & wVar8,nVars,pTable,vNpns,vNpns_);
                    uVar18 = ~uVar15 & uVar12;
                    Dau_AddFunction(wVar8 & ~uVar18 | uVar18 & wVar11,nVars,pTable,vNpns,vNpns_);
                    Dau_AddFunction(~uVar18 & wVar11 | uVar18 & wVar8,nVars,pTable,vNpns,vNpns_);
                    uVar18 = ~uVar12 & uVar15;
                    local_110 = uVar19;
                    Dau_AddFunction(wVar8 & ~uVar18 | uVar18 & wVar11,nVars,pTable,vNpns,vNpns_);
                    local_108 = lVar20;
                    Dau_AddFunction(~uVar18 & wVar11 | uVar18 & wVar8,nVars,pTable,vNpns,vNpns_);
                    uVar19 = local_110;
                    uVar15 = uVar15 | uVar12;
                    Dau_AddFunction(uVar15 & wVar8 | wVar11 & ~uVar15,nVars,pTable,vNpns,vNpns_);
                    uVar12 = uVar15 & wVar11 | ~uVar15 & wVar8;
                    lVar20 = local_108;
                  }
                  else {
                    uVar12 = (wVar11 ^ wVar8) & (uVar15 ^ uVar12) ^ wVar8;
                  }
                  Dau_AddFunction(uVar12,nVars,pTable,vNpns,vNpns_);
                  lVar6 = local_150;
                  uVar12 = local_178;
                  iVar5 = local_16c;
                }
                uVar19 = uVar19 - 1;
              }
            }
            uVar12 = uVar12 + 1;
            local_160 = local_160 + 1;
            local_1c0 = local_1c0 + -8;
            uVar19 = local_180;
            uVar15 = local_158 + 1;
          }
        }
        local_168 = local_168 - 1;
      }
    }
    uVar13 = vNpns->nSize;
    uVar3 = Vec_WecSizeSize(p);
    uVar2 = vNpns_->nSize;
    uVar4 = Vec_WecSizeSize(local_188);
    uVar19 = local_148;
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",local_148,
           (ulong)uVar13,(ulong)uVar3,(ulong)uVar2,(ulong)uVar4);
    aVar10 = Abc_Clock();
    Abc_PrintTime(0x816bba,(char *)(aVar10 - local_190),time_00);
    fflush(_stdout);
    uVar19 = (ulong)((int)uVar19 + 1);
  } while (vNpns->nSize != 0);
  Vec_WecFree(p);
  Vec_WecFree(local_188);
  free(pTable);
  aVar10 = Abc_Clock();
  Abc_PrintTime(0x79ec86,(char *)(aVar10 - local_190),time_01);
  fflush(_stdout);
  return;
}

Assistant:

void Dau_NetworkEnum(int nVars)
{
    abctime clk = Abc_Clock();
    int Limit = 2;
    int UseTwo = 0;
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    char pFileName[200];
    unsigned * pTable;
    Vec_Wec_t * vNpns  = Vec_WecStart( 32 );
    Vec_Wec_t * vNpns_ = Vec_WecStart( 32 );
    int i, v, u, g, k, m, n, Res, Entry;
    unsigned Inv = (unsigned)Abc_Tt6Mask(1 << (nVars-1));
    sprintf( pFileName, "tableW%d.data", nSizeLog );
    pTable  = Dau_ReadFile( pFileName, nSizeW );
    // create constant function and buffer/inverter function
    pTable[0]   |= (1 << 31);
    pTable[Inv] |= (1 << 31);
    Vec_IntPushTwo( Vec_WecEntry(vNpns,  0), 0, Inv );
    Vec_IntPushTwo( Vec_WecEntry(vNpns_, 0), 0, Inv );
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
        0, Vec_IntSize(Vec_WecEntry(vNpns,  0)), Vec_WecSizeSize(vNpns), 
           Vec_IntSize(Vec_WecEntry(vNpns_, 0)), Vec_WecSizeSize(vNpns_) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n < 32; n++ )
    {
        Vec_Int_t * vFuncsN2 = n > 1 ? Vec_WecEntry( vNpns, n-2 ) : NULL;
        Vec_Int_t * vFuncsN1 = Vec_WecEntry( vNpns, n-1 );
        Vec_Int_t * vFuncsN  = Vec_WecEntry( vNpns, n   );
        Vec_Int_t * vFuncsN_ = Vec_WecEntry( vNpns_,n   );
        Vec_IntForEachEntry( vFuncsN1, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );
                for ( g = 0; g < Limit; g++ )
                {
                    if ( nSupp < nVars )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add one cross bar
                    for ( k = 0; k < nSupp; k++ ) if ( k != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-v] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add two cross bars
                    for ( k = 0;   k < nSupp; k++ ) if ( k != v )
                    for ( m = k+1; m < nSupp; m++ ) if ( m != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-m] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
            }
        }
        if ( UseTwo && vFuncsN2 )
        Vec_IntForEachEntry( vFuncsN2, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
//            for ( u = v+1; u < nSupp; u++ ) if ( u != v )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word tGate1, tGate2, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, nVars-1-u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, nVars-1-u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, nVars-1-u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, nVars-1-u );

                tGate1 = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-u];
                tGate2 = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-u];

                Cof0  = (tGate2 & Cof00) | (~tGate2 & Cof01);
                Cof1  = (tGate2 & Cof10) | (~tGate2 & Cof11);

                tCur  = (tGate1 & Cof1)  | (~tGate1 & Cof0);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );

                tCur  = (tGate1 & Cof0)  | (~tGate1 & Cof1);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );
            }
        }
        printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
            n, Vec_IntSize(vFuncsN), Vec_WecSizeSize(vNpns), Vec_IntSize(vFuncsN_), Vec_WecSizeSize(vNpns_) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        fflush(stdout);
        if ( Vec_IntSize(vFuncsN) == 0 )
            break;
    }
//    printf( "Functions with 7 nodes:\n" );
//    Vec_IntForEachEntry( Vec_WecEntry(vNpns_,7), Entry, i )
//        printf( "%04x ", Entry );
//    printf( "\n" );

    Vec_WecFree( vNpns );
    Vec_WecFree( vNpns_ );
    ABC_FREE( pTable );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    fflush(stdout);
}